

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

Expression *
soul::ExpressionHelpers::forVariable
          (Expression *__return_storage_ptr__,VariableDeclaration *v,StringDictionary *dictionary)

{
  int iVar1;
  long lVar2;
  Expression *pEVar3;
  Type local_30;
  
  pEVar3 = (v->declaredType).object;
  if (pEVar3 == (Expression *)0x0) {
    pEVar3 = (v->initialValue).object;
    if (pEVar3 == (Expression *)0x0) {
      throwInternalCompilerError("v.initialValue != nullptr","forVariable",0xb1);
    }
    iVar1 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])();
    if ((char)iVar1 != '\0') {
      pEVar3 = (v->initialValue).object;
      if (pEVar3 != (Expression *)0x0) {
        (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_30);
        create(__return_storage_ptr__,&local_30);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
        return __return_storage_ptr__;
      }
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    pEVar3 = (v->initialValue).object;
    if (pEVar3 == (Expression *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = __dynamic_cast(pEVar3,&AST::Expression::typeinfo,&AST::CallOrCast::typeinfo,0);
    }
    if (lVar2 == 0) {
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->sections).
      super__Vector_base<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    }
    pEVar3 = *(Expression **)(lVar2 + 0x40);
  }
  create(__return_storage_ptr__,pEVar3,dictionary);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression forVariable (AST::VariableDeclaration& v, const StringDictionary& dictionary)
    {
        if (v.declaredType != nullptr)
            return create (*v.declaredType, dictionary);

        SOUL_ASSERT (v.initialValue != nullptr);

        if (v.initialValue->isResolved())
            return create (v.initialValue->getResultType());

        if (auto cc = cast<AST::CallOrCast> (v.initialValue))
            return create (cc->nameOrType, dictionary);

        return {};
    }